

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheNewNodeSet(xmlXPathParserContextPtr pctxt,xmlNodePtr val)

{
  xmlXPathContextPtr pxVar1;
  long *plVar2;
  int iVar3;
  xmlNodeSetPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlNodeSetPtr set;
  xmlXPathContextCachePtr cache;
  xmlXPathContextPtr ctxt;
  xmlXPathObjectPtr ret;
  xmlNodePtr val_local;
  xmlXPathParserContextPtr pctxt_local;
  
  pxVar1 = pctxt->context;
  if ((pxVar1 != (xmlXPathContextPtr)0x0) && (pxVar1->cache != (void *)0x0)) {
    plVar2 = (long *)pxVar1->cache;
    if (*plVar2 != 0) {
      pxVar5 = (xmlXPathObjectPtr)*plVar2;
      *plVar2 = (long)pxVar5->stringval;
      *(int *)(plVar2 + 2) = (int)plVar2[2] + -1;
      pxVar5->stringval = (xmlChar *)0x0;
      pxVar5->type = XPATH_NODESET;
      pxVar5->boolval = 0;
      if (val == (xmlNodePtr)0x0) {
        return pxVar5;
      }
      if ((pxVar5->nodesetval->nodeMax != 0) && (val->type != XML_NAMESPACE_DECL)) {
        *pxVar5->nodesetval->nodeTab = val;
        pxVar5->nodesetval->nodeNr = 1;
        return pxVar5;
      }
      iVar3 = xmlXPathNodeSetAddUnique(pxVar5->nodesetval,val);
      if (-1 < iVar3) {
        return pxVar5;
      }
      xmlXPathPErrMemory(pctxt);
      return pxVar5;
    }
    if (plVar2[1] != 0) {
      pxVar4 = xmlXPathNodeSetCreate(val);
      if (pxVar4 == (xmlNodeSetPtr)0x0) {
        xmlXPathPErrMemory(pctxt);
        return (xmlXPathObjectPtr)0x0;
      }
      pxVar5 = (xmlXPathObjectPtr)plVar2[1];
      plVar2[1] = (long)pxVar5->stringval;
      *(int *)(plVar2 + 3) = (int)plVar2[3] + -1;
      pxVar5->stringval = (xmlChar *)0x0;
      pxVar5->type = XPATH_NODESET;
      pxVar5->boolval = 0;
      pxVar5->nodesetval = pxVar4;
      return pxVar5;
    }
  }
  pxVar5 = xmlXPathNewNodeSet(val);
  if (pxVar5 == (xmlXPathObjectPtr)0x0) {
    xmlXPathPErrMemory(pctxt);
  }
  return pxVar5;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewNodeSet(xmlXPathParserContextPtr pctxt, xmlNodePtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->nodesetObjs != NULL) {
	    /*
	    * Use the nodeset-cache.
	    */
	    ret = cache->nodesetObjs;
            cache->nodesetObjs = (void *) ret->stringval;
            cache->numNodeset -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->boolval = 0;
	    if (val) {
		if ((ret->nodesetval->nodeMax == 0) ||
		    (val->type == XML_NAMESPACE_DECL))
		{
		    if (xmlXPathNodeSetAddUnique(ret->nodesetval, val) < 0)
                        xmlXPathPErrMemory(pctxt);
		} else {
		    ret->nodesetval->nodeTab[0] = val;
		    ret->nodesetval->nodeNr = 1;
		}
	    }
	    return(ret);
	} else if (cache->miscObjs != NULL) {
            xmlNodeSetPtr set;
	    /*
	    * Fallback to misc-cache.
	    */

	    set = xmlXPathNodeSetCreate(val);
	    if (set == NULL) {
                xmlXPathPErrMemory(pctxt);
		return(NULL);
	    }

	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->boolval = 0;
	    ret->nodesetval = set;
	    return(ret);
	}
    }
    ret = xmlXPathNewNodeSet(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}